

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O3

DynamicObject * __thiscall
JsrtDebugManager::GetSource(JsrtDebugManager *this,ScriptContext *scriptContext,uint scriptId)

{
  RecyclerWeakReference<Js::Utf8SourceInfo> *pRVar1;
  Utf8SourceInfo *pUVar2;
  int iVar3;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar4;
  DynamicObject *pDVar5;
  long lVar6;
  long lVar7;
  ScriptContext *pSVar8;
  Utf8SourceInfo *utf8SourceInfo;
  
  pSVar8 = this->threadContext->scriptContextList;
  if (pSVar8 != (ScriptContext *)0x0) {
    do {
      iVar3 = (*(pSVar8->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(pSVar8);
      if ((char)iVar3 != '\0') {
        return (DynamicObject *)0x0;
      }
      pLVar4 = Memory::
               RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
               ::operator->(&pSVar8->sourceList);
      lVar6 = (long)(pLVar4->
                    super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                    ).count;
      if (lVar6 < 1) {
        utf8SourceInfo = (Utf8SourceInfo *)0x0;
      }
      else {
        utf8SourceInfo = (Utf8SourceInfo *)0x0;
        lVar7 = 0;
        do {
          pRVar1 = (pLVar4->
                   super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                   ).buffer.ptr[lVar7].ptr;
          if ((((((ulong)pRVar1 & 1) == 0 &&
                 pRVar1 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0) &&
               (pUVar2 = (Utf8SourceInfo *)(pRVar1->super_RecyclerWeakReferenceBase).strongRef,
               pUVar2 != (Utf8SourceInfo *)0x0)) &&
              ((byte)((pUVar2->field_0xa8 & 0x40) >> 6 &
                     ((byte)pUVar2->field_0xa8 >> 5 | (pUVar2->debugModeSource).ptr != (uchar *)0x0)
                     ) == 1)) && (pUVar2->m_sourceInfoId == scriptId)) {
            utf8SourceInfo = pUVar2;
          }
          lVar7 = lVar7 + 1;
        } while (lVar6 != lVar7);
      }
      pSVar8 = pSVar8->next;
    } while ((pSVar8 != (ScriptContext *)0x0) && (utf8SourceInfo == (Utf8SourceInfo *)0x0));
    if (utf8SourceInfo != (Utf8SourceInfo *)0x0) {
      pSVar8 = (utf8SourceInfo->m_scriptContext).ptr;
      pDVar5 = Js::JavascriptLibrary::CreateObject
                         ((scriptContext->super_ScriptContextBase).javascriptLibrary,false,0);
      pDVar5 = (DynamicObject *)Js::CrossSite::MarshalVar(pSVar8,pDVar5,false);
      JsrtDebugUtils::AddSourceMetadataToObject(pDVar5,utf8SourceInfo);
      JsrtDebugUtils::AddSourceToObject(pDVar5,utf8SourceInfo);
      return pDVar5;
    }
  }
  return (DynamicObject *)0x0;
}

Assistant:

Js::DynamicObject* JsrtDebugManager::GetSource(Js::ScriptContext* scriptContext, uint scriptId)
{
    Js::Utf8SourceInfo* utf8SourceInfo = nullptr;

    for (Js::ScriptContext *tempScriptContext = this->threadContext->GetScriptContextList();
    tempScriptContext != nullptr && utf8SourceInfo == nullptr && !tempScriptContext->IsClosed();
        tempScriptContext = tempScriptContext->next)
    {
        tempScriptContext->MapScript([&](Js::Utf8SourceInfo* sourceInfo) -> bool
        {
            if (sourceInfo->IsInDebugMode() && sourceInfo->GetSourceInfoId() == scriptId)
            {
                utf8SourceInfo = sourceInfo;
                return true;
            }
            return false;
        });
    }

    Js::DynamicObject* sourceObject = nullptr;

    if (utf8SourceInfo != nullptr)
    {
        sourceObject = (Js::DynamicObject*)Js::CrossSite::MarshalVar(utf8SourceInfo->GetScriptContext(), scriptContext->GetLibrary()->CreateObject());

        JsrtDebugUtils::AddSourceMetadataToObject(sourceObject, utf8SourceInfo);
        JsrtDebugUtils::AddSourceToObject(sourceObject, utf8SourceInfo);
    }

    return sourceObject;
}